

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

SequenceDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSequenceDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  AssertionItemPortListSyntax *portList;
  SequenceExprSyntax *seqExpr;
  NamedBlockClauseSyntax *endBlock;
  undefined4 extraout_var;
  SequenceDeclarationSyntax *pSVar3;
  EVP_PKEY_CTX *src;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_00;
  Token keyword;
  Token nameToken;
  Token semi;
  Token optionalSemi;
  Token end;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_e0;
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> declarations;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> local_68;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  nameToken = ParserBase::expect(&this->super_ParserBase,Identifier);
  portList = parseAssertionItemPortList(this,SequenceDeclaration);
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.data_ =
       (pointer)declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.
                firstElement;
  declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.len = 0;
  declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>.cap = 5;
  while( true ) {
    bVar1 = isLocalVariableDeclaration(this);
    if (!bVar1) break;
    local_e0.super_SyntaxListBase._vptr_SyntaxListBase =
         (_func_int **)parseLocalVariableDeclaration(this);
    SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*>::
    emplace_back<slang::syntax::LocalVariableDeclarationSyntax*>
              ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax*> *)&declarations,
               (LocalVariableDeclarationSyntax **)&local_e0);
  }
  seqExpr = parseSequenceExpr(this,0,false);
  optionalSemi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  end = ParserBase::expect(&this->super_ParserBase,EndSequenceKeyword);
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,nameToken,endBlock);
  local_e0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_e0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_e0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_e0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057dcc8;
  local_e0.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_e0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_e0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  iVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::copy
                    (&declarations.
                      super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_68.super_span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL>.
  _M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057ed28;
  attributes_00 = &local_e0;
  pSVar3 = slang::syntax::SyntaxFactory::sequenceDeclaration
                     (&this->factory,attributes_00,keyword,nameToken,portList,semi,&local_68,seqExpr
                      ,optionalSemi,end,endBlock);
  SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::cleanup
            (&declarations.super_SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>,
             (EVP_PKEY_CTX *)attributes_00);
  return pSVar3;
}

Assistant:

SequenceDeclarationSyntax& Parser::parseSequenceDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::SequenceDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    SmallVector<LocalVariableDeclarationSyntax*> declarations;
    while (isLocalVariableDeclaration())
        declarations.push_back(&parseLocalVariableDeclaration());

    auto& expr = parseSequenceExpr(0, /* isInProperty */ false);
    auto semi2 = expect(TokenKind::Semicolon);
    auto end = expect(TokenKind::EndSequenceKeyword);

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.sequenceDeclaration(attributes, keyword, name, portList, semi,
                                       declarations.copy(alloc), expr, semi2, end, blockName);
}